

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteGraph.h
# Opt level: O0

RWNode * __thiscall dg::dda::ReadWriteGraph::create(ReadWriteGraph *this,RWNodeType t)

{
  RWNodeCall **__args;
  void *pvVar1;
  pointer pRVar2;
  int in_ESI;
  long *in_RDI;
  undefined8 in_stack_ffffffffffffffb8;
  uint id;
  RWNodeCall *in_stack_ffffffffffffffc0;
  RWNode **in_stack_ffffffffffffffc8;
  vector<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>,_std::allocator<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>_>_>
  *in_stack_ffffffffffffffd0;
  vector<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>,_std::allocator<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>_>_>
  *this_00;
  
  id = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (in_ESI == 0xd) {
    this_00 = (vector<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>,_std::allocator<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>_>_>
               *)(in_RDI + 1);
    __args = (RWNodeCall **)operator_new(0x1a8);
    *in_RDI = *in_RDI + 1;
    RWNodeCall::RWNodeCall(in_stack_ffffffffffffffc0,id);
    std::
    vector<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>,std::allocator<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>>>
    ::emplace_back<dg::dda::RWNodeCall*>(this_00,__args);
  }
  else {
    in_stack_ffffffffffffffc0 = (RWNodeCall *)(in_RDI + 1);
    pvVar1 = operator_new(0x150);
    *in_RDI = *in_RDI + 1;
    RWNode::RWNode(&in_stack_ffffffffffffffc0->super_RWNode,(uint)((ulong)pvVar1 >> 0x20),
                   (RWNodeType)pvVar1);
    std::
    vector<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>,std::allocator<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>>>
    ::emplace_back<dg::dda::RWNode*>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  std::
  vector<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>,_std::allocator<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>_>_>
  ::back((vector<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>,_std::allocator<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>_>_>
          *)in_stack_ffffffffffffffc0);
  pRVar2 = std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>::get
                     ((unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_> *)0x18f246
                     );
  return pRVar2;
}

Assistant:

RWNode &create(RWNodeType t) {
        if (t == RWNodeType::CALL) {
            _nodes.emplace_back(new RWNodeCall(++lastNodeID));
        } else {
            _nodes.emplace_back(new RWNode(++lastNodeID, t));
        }
        return *_nodes.back().get();
    }